

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawDoubleSky4PalCommand::Execute(DrawDoubleSky4PalCommand *this,DrawerThread *thread)

{
  int *piVar1;
  BYTE BVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  PalEntry PVar10;
  int col_1;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int col;
  long lVar17;
  uint8_t uVar18;
  uint uVar19;
  int col_2;
  byte bVar20;
  uint *puVar21;
  uint8_t output [4];
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  long local_e8;
  uint local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint *local_c8;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  DrawDoubleSky4PalCommand *local_80;
  uint8_t *local_78 [4];
  uint8_t *local_58 [5];
  
  local_c8 = (uint *)(this->super_PalSkyCommand)._dest;
  local_b0 = (this->super_PalSkyCommand)._count;
  iVar16 = (this->super_PalSkyCommand)._pitch;
  local_58[0] = (this->super_PalSkyCommand)._source[0];
  local_58[1] = (this->super_PalSkyCommand)._source[1];
  local_58[2] = (this->super_PalSkyCommand)._source[2];
  local_58[3] = (this->super_PalSkyCommand)._source[3];
  local_78[0] = (this->super_PalSkyCommand)._source2[0];
  local_78[1] = (this->super_PalSkyCommand)._source2[1];
  local_78[2] = (this->super_PalSkyCommand)._source2[2];
  local_78[3] = (this->super_PalSkyCommand)._source2[3];
  iVar3 = (this->super_PalSkyCommand)._sourceheight[0];
  iVar4 = (this->super_PalSkyCommand)._sourceheight[1];
  uVar5 = (this->super_PalSkyCommand)._texturefrac[0];
  local_d8 = *(undefined8 *)(this->super_PalSkyCommand)._texturefrac;
  uStack_d0 = *(undefined8 *)((this->super_PalSkyCommand)._texturefrac + 2);
  uVar6 = (this->super_PalSkyCommand)._iscale[0];
  local_98 = *(undefined8 *)(this->super_PalSkyCommand)._iscale;
  uStack_90 = *(undefined8 *)((this->super_PalSkyCommand)._iscale + 2);
  uVar7 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  local_ac = uVar7 & 0xff;
  bVar20 = RGB32k.All
           [(ulong)(local_ac >> 3) + (ulong)(uVar7 >> 6 & 0x3e0) + (ulong)(uVar7 >> 9 & 0x7c00)];
  uVar19 = (this->super_PalSkyCommand).solid_bottom;
  local_a8 = uVar7 >> 0x10 & 0xff;
  local_a0 = uVar19 >> 0x10 & 0xff;
  local_a4 = uVar19 >> 8 & 0xff;
  local_9c = uVar19 & 0xff;
  local_b8 = (uint)RGB32k.All
                   [(ulong)(local_9c >> 3) +
                    (ulong)(uVar19 >> 6 & 0x3e0) + (ulong)(uVar19 >> 9 & 0x7c00)];
  local_dc = local_b8 << 8 |
             (uint)RGB32k.All
                   [(ulong)(local_9c >> 3) +
                    (ulong)(uVar19 >> 6 & 0x3e0) + (ulong)(uVar19 >> 9 & 0x7c00)] << 0x10 |
             local_b8 << 0x18;
  local_e8 = CONCAT44(local_e8._4_4_,
                      (uint)bVar20 << 8 | (uint)bVar20 << 0x10 | (uint)bVar20 << 0x18 | (uint)bVar20
                     );
  local_c0 = (int)(0x400000 - uVar5) / (int)uVar6;
  uVar19 = (int)(0x1c00000 - uVar5) / (int)uVar6;
  local_b4 = (int)(0x2000000 - uVar5) / (int)uVar6;
  local_f4 = -((int)uVar5 / (int)uVar6);
  if ((int)local_b0 <= (int)local_f4) {
    local_f4 = local_b0;
  }
  local_f4 = (int)uVar5 / (int)uVar6 >> 0x1f & local_f4;
  local_f0 = local_b0;
  if ((int)local_c0 < (int)local_b0) {
    local_f0 = local_c0;
  }
  local_bc = local_b0;
  if ((int)uVar19 < (int)local_b0) {
    local_bc = uVar19;
  }
  lVar17 = 0;
  if ((int)uVar19 < 1) {
    local_bc = 0;
  }
  local_ec = local_b0;
  if ((int)local_b4 < (int)local_b0) {
    local_ec = local_b4;
  }
  local_80 = this;
  iVar11 = DrawerThread::skipped_by_thread
                     (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y);
  iVar12 = DrawerThread::skipped_by_thread
                     (thread,(local_80->super_PalSkyCommand).super_DrawerCommand._dest_y);
  iVar8 = thread->num_cores;
  for (; lVar17 != 4; lVar17 = lVar17 + 1) {
    iVar9 = *(int *)((long)&local_98 + lVar17 * 4);
    piVar1 = (int *)((long)&local_d8 + lVar17 * 4);
    *piVar1 = *piVar1 + iVar9 * iVar11;
    *(int *)((long)&local_98 + lVar17 * 4) = iVar9 * iVar8;
  }
  uVar19 = iVar4 - 1;
  puVar21 = (uint *)((long)local_c8 + (long)(iVar12 * iVar16));
  lVar17 = (long)(iVar16 * iVar8);
  for (; iVar11 < (int)local_f4; iVar11 = iVar11 + iVar8) {
    *puVar21 = (uint)local_e8;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      piVar1 = (int *)((long)&local_d8 + lVar14 * 4);
      *piVar1 = *piVar1 + *(int *)((long)&local_98 + lVar14 * 4);
    }
    puVar21 = (uint *)((long)puVar21 + lVar17);
  }
  local_f4 = iVar8;
  local_e8 = lVar17;
  if ((int)local_c0 < 1) {
    local_f0 = 0;
  }
  while (lVar17 = local_e8, uVar13 = local_f4, iVar11 < (int)local_f0) {
    local_c8 = puVar21;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      uVar13 = *(uint *)((long)&local_d8 + lVar17 * 4);
      uVar15 = (uVar13 >> 8 & 0xffff) * iVar3 >> 0x10;
      bVar20 = local_58[lVar17][uVar15];
      if (bVar20 == 0) {
        if (uVar19 <= uVar15) {
          uVar15 = uVar19;
        }
        bVar20 = local_78[lVar17][uVar15];
      }
      PVar10.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[bVar20].field_0.d
      ;
      uVar15 = (int)uVar13 >> 0xe;
      if (0xff < (int)uVar15) {
        uVar15 = 0x100;
      }
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      iVar16 = 0x100 - uVar15;
      BVar2 = RGB32k.All
              [(ulong)(iVar16 * local_ac + ((uint)PVar10.field_0 & 0xff) * uVar15 >> 0xb) +
               (ulong)(iVar16 * (uVar7 >> 8 & 0xff) + ((uint)PVar10.field_0 >> 8 & 0xff) * uVar15 >>
                       6 & 0xfe0) +
               (ulong)(iVar16 * local_a8 + ((uint)PVar10.field_0 >> 0x10 & 0xff) * uVar15 >> 1 &
                      0x1fc00)];
      *(uint *)((long)&local_d8 + lVar17 * 4) = uVar13 + *(int *)((long)&local_98 + lVar17 * 4);
      *(BYTE *)((long)&local_f8 + lVar17) = BVar2;
    }
    *local_c8 = local_f8;
    puVar21 = (uint *)((long)local_c8 + local_e8);
    iVar11 = iVar11 + local_f4;
  }
  local_dc = local_dc | local_b8;
  while( true ) {
    lVar14 = 0;
    if ((int)local_bc <= iVar11) break;
    for (; lVar14 != 4; lVar14 = lVar14 + 1) {
      uVar7 = *(uint *)((long)&local_d8 + lVar14 * 4);
      uVar15 = (uVar7 >> 8 & 0xffff) * iVar3 >> 0x10;
      uVar18 = local_58[lVar14][uVar15];
      if (uVar18 == '\0') {
        if (uVar19 <= uVar15) {
          uVar15 = uVar19;
        }
        uVar18 = local_78[lVar14][uVar15];
      }
      *(uint8_t *)((long)&local_f8 + lVar14) = uVar18;
      *(uint *)((long)&local_d8 + lVar14 * 4) = uVar7 + *(int *)((long)&local_98 + lVar14 * 4);
    }
    *puVar21 = local_f8;
    puVar21 = (uint *)((long)puVar21 + lVar17);
    iVar11 = iVar11 + uVar13;
  }
  if ((int)local_b4 < 1) {
    local_ec = 0;
  }
  for (; iVar11 < (int)local_ec; iVar11 = iVar11 + local_f4) {
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      uVar7 = *(uint *)((long)&local_d8 + lVar17 * 4);
      uVar13 = (uVar7 >> 8 & 0xffff) * iVar3 >> 0x10;
      bVar20 = local_58[lVar17][uVar13];
      if (bVar20 == 0) {
        if (uVar19 <= uVar13) {
          uVar13 = uVar19;
        }
        bVar20 = local_78[lVar17][uVar13];
      }
      PVar10.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[bVar20].field_0.d
      ;
      uVar13 = (int)(0x2000000 - uVar7) >> 0xe;
      if (0xff < (int)uVar13) {
        uVar13 = 0x100;
      }
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      iVar16 = 0x100 - uVar13;
      BVar2 = RGB32k.All
              [(ulong)(iVar16 * local_9c + ((uint)PVar10.field_0 & 0xff) * uVar13 >> 0xb) +
               (ulong)(iVar16 * local_a4 + ((uint)PVar10.field_0 >> 8 & 0xff) * uVar13 >> 6 & 0xfe0)
               + (ulong)(iVar16 * local_a0 + ((uint)PVar10.field_0 >> 0x10 & 0xff) * uVar13 >> 1 &
                        0x1fc00)];
      *(uint *)((long)&local_d8 + lVar17 * 4) = uVar7 + *(int *)((long)&local_98 + lVar17 * 4);
      *(BYTE *)((long)&local_f8 + lVar17) = BVar2;
    }
    *puVar21 = local_f8;
    puVar21 = (uint *)((long)puVar21 + local_e8);
    uVar13 = local_f4;
  }
  for (; iVar11 < (int)local_b0; iVar11 = iVar11 + uVar13) {
    *puVar21 = local_dc;
    puVar21 = (uint *)((long)puVar21 + local_e8);
  }
  return;
}

Assistant:

void DrawDoubleSky4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0[4] = { _source[0], _source[1], _source[2], _source[3] };
		const uint8_t *source1[4] = { _source2[0], _source2[1], _source2[2], _source2[3] };
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;
		const uint32_t *palette = (const uint32_t *)GPalette.BaseColors;
		int32_t frac[4] = { (int32_t)_texturefrac[0], (int32_t)_texturefrac[1], (int32_t)_texturefrac[2], (int32_t)_texturefrac[3] };
		int32_t fracstep[4] = { (int32_t)_iscale[0], (int32_t)_iscale[1], (int32_t)_iscale[2], (int32_t)_iscale[3] };
		uint8_t output[4];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);
		uint32_t solid_top_fill = RGB32k.RGB[(solid_top_r >> 3)][(solid_top_g >> 3)][(solid_top_b >> 3)];
		uint32_t solid_bottom_fill = RGB32k.RGB[(solid_bottom_r >> 3)][(solid_bottom_g >> 3)][(solid_bottom_b >> 3)];
		solid_top_fill = (solid_top_fill << 24) | (solid_top_fill << 16) | (solid_top_fill << 8) | solid_top_fill;
		solid_bottom_fill = (solid_bottom_fill << 24) | (solid_bottom_fill << 16) | (solid_bottom_fill << 8) | solid_bottom_fill;

		// Find bands for top solid color, top fade, center textured, bottom fade, bottom solid color:
		int fade_length = (1 << (24 - start_fade));
		int start_fadetop_y = (-frac[0]) / fracstep[0];
		int end_fadetop_y = (fade_length - frac[0]) / fracstep[0];
		int start_fadebottom_y = ((2 << 24) - fade_length - frac[0]) / fracstep[0];
		int end_fadebottom_y = ((2 << 24) - frac[0]) / fracstep[0];
		for (int col = 1; col < 4; col++)
		{
			start_fadetop_y = MIN(start_fadetop_y, (-frac[0]) / fracstep[0]);
			end_fadetop_y = MAX(end_fadetop_y, (fade_length - frac[0]) / fracstep[0]);
			start_fadebottom_y = MIN(start_fadebottom_y, ((2 << 24) - fade_length - frac[0]) / fracstep[0]);
			end_fadebottom_y = MAX(end_fadebottom_y, ((2 << 24) - frac[0]) / fracstep[0]);
		}
		start_fadetop_y = clamp(start_fadetop_y, 0, count);
		end_fadetop_y = clamp(end_fadetop_y, 0, count);
		start_fadebottom_y = clamp(start_fadebottom_y, 0, count);
		end_fadebottom_y = clamp(end_fadebottom_y, 0, count);

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int col = 0; col < 4; col++)
		{
			frac[col] += fracstep[col] * skipped;
			fracstep[col] *= thread->num_cores;
		}
		pitch *= thread->num_cores;
		int num_cores = thread->num_cores;
		int index = skipped;

		// Top solid color:
		while (index < start_fadetop_y)
		{
			*((uint32_t*)dest) = solid_top_fill;
			dest += pitch;
			for (int col = 0; col < 4; col++)
				frac[col] += fracstep[col];
			index += num_cores;
		}

		// Top fade:
		while (index < end_fadetop_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_top = MAX(MIN(frac[col] >> (16 - start_fade), 256), 0);
				int inv_alpha_top = 256 - alpha_top;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Textured center:
		while (index < start_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				frac[col] += fracstep[col];
			}

			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Fade bottom:
		while (index < end_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_bottom = MAX(MIN(((2 << 24) - frac[col]) >> (16 - start_fade), 256), 0);
				int inv_alpha_bottom = 256 - alpha_bottom;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Bottom solid color:
		while (index < count)
		{
			*((uint32_t*)dest) = solid_bottom_fill;
			dest += pitch;
			index += num_cores;
		}
	}